

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

itemstruct_t * find_nearby_item(tgestate_t *state)

{
  itemstruct_t *piVar1;
  int iVar2;
  char cVar3;
  mappos8_t *pmVar4;
  mappos8_t *pmVar5;
  bool bVar6;
  bool bVar7;
  
  iVar2 = (uint)(state->room_index != '\0') * 5 + 1;
  piVar1 = state->item_structs;
  cVar3 = '\x10';
  do {
    if ((char)piVar1->room_and_flags < '\0') {
      pmVar4 = &piVar1->mappos;
      bVar6 = true;
      pmVar5 = &state->hero_mappos;
      do {
        bVar7 = (uint)pmVar4->u <= (uint)pmVar5->u + iVar2 &&
                (int)((uint)pmVar5->u - iVar2) < (int)(uint)pmVar4->u;
        if (!bVar6) break;
        pmVar5 = (mappos8_t *)&pmVar5->v;
        pmVar4 = (mappos8_t *)(&pmVar4->u + bVar7);
        bVar6 = false;
      } while (bVar7);
      if (bVar7) {
        return piVar1;
      }
    }
    piVar1 = piVar1 + 1;
    cVar3 = cVar3 + -1;
    if (cVar3 == '\0') {
      return (itemstruct_t *)0x0;
    }
  } while( true );
}

Assistant:

itemstruct_t *find_nearby_item(tgestate_t *state)
{
  uint8_t       radius;  /* was C */
  uint8_t       iters;   /* was B */
  itemstruct_t *itemstr; /* was HL */

  assert(state != NULL);

  /* Select a pick up radius. */
  radius = 1; /* Outdoors. */
  if (state->room_index > room_0_OUTDOORS)
    radius = 6; /* Indoors. */

  /* For all items. */
  iters   = item__LIMIT;
  itemstr = &state->item_structs[0];
  do
  {
    if (itemstr->room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
    {
      uint8_t *structcoord; /* was HL */
      uint8_t *herocoord;   /* was DE */
      uint8_t  coorditers;  /* was B */

      // FUTURE: Candidate for loop unrolling.
      structcoord = &itemstr->mappos.u;
      herocoord   = &state->hero_mappos.u;
      coorditers = 2;
      /* Range check. */
      do
      {
        uint8_t A;

        A = *herocoord++; /* get hero map position */
        if (A - radius >= *structcoord || A + radius < *structcoord)
          goto next;
        structcoord++;
      }
      while (--coorditers);

      return itemstr;
    }

next:
    itemstr++;
  }
  while (--iters);

  return NULL;
}